

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakCallback.h
# Opt level: O1

void __thiscall
sznet::WeakCallback<sznet::net::KcpConnection>::operator()
          (WeakCallback<sznet::net::KcpConnection> *this)

{
  int iVar1;
  element_type *peVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  element_type *local_20;
  
  this_00 = (this->m_object).super___weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_00->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = iVar3 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = this_00->_M_use_count == 0;
  }
  peVar2 = (this->m_object).super___weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (!(bool)(peVar2 == (element_type *)0x0 | bVar4)) {
    local_20 = peVar2;
    if ((this->m_function).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->m_function)._M_invoker)((_Any_data *)&this->m_function,&local_20);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void operator()(ARGS&&... args) const
	{
		// �����Ƿ�����
		std::shared_ptr<CLASS> ptr(m_object.lock());
		if (ptr)
		{
			// û�п����͵��ûص�����
			m_function(ptr.get(), std::forward<ARGS>(args)...);
		}
		// else
		// {
		//   LOG_TRACE << "expired";
		// }
	}